

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

void __thiscall QTreeViewPrivate::removeViewItems(QTreeViewPrivate *this,int pos,int count)

{
  QList<QTreeViewItem> *this_00;
  Data *pDVar1;
  long lVar2;
  pointer pQVar3;
  int *piVar4;
  long lVar5;
  
  this_00 = &this->viewItems;
  lVar5 = (long)pos;
  if (count != 0) {
    pDVar1 = (this_00->d).d;
    if ((pDVar1 == (Data *)0x0) ||
       (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QArrayDataPointer<QTreeViewItem>::reallocateAndGrow
                (&this_00->d,GrowsAtEnd,0,(QArrayDataPointer<QTreeViewItem> *)0x0);
    }
    QtPrivate::QMovableArrayOps<QTreeViewItem>::erase
              ((QMovableArrayOps<QTreeViewItem> *)this_00,(this->viewItems).d.ptr + lVar5,
               (long)count);
  }
  pQVar3 = QList<QTreeViewItem>::data(this_00);
  lVar2 = (this->viewItems).d.size;
  if (lVar5 < lVar2) {
    piVar4 = &pQVar3[lVar5].parentItem;
    do {
      if (pos <= *piVar4) {
        *piVar4 = *piVar4 - count;
      }
      lVar5 = lVar5 + 1;
      piVar4 = piVar4 + 10;
    } while (lVar5 < lVar2);
  }
  return;
}

Assistant:

void QTreeViewPrivate::removeViewItems(int pos, int count)
{
    viewItems.remove(pos, count);
    QTreeViewItem *items = viewItems.data();
    for (int i = pos; i < viewItems.size(); i++)
        if (items[i].parentItem >= pos)
            items[i].parentItem -= count;
}